

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O0

void sysbvm_jit_x86_movImmediateI32IntoMemory64WithOffset
               (sysbvm_bytecodeJit_t *jit,sysbvm_x86_register_t destination,int32_t offset,
               int16_t immediate)

{
  uint8_t local_25 [3];
  uint8_t local_22;
  uint8_t local_21;
  uint8_t local_20;
  uint8_t local_1f;
  uint8_t local_1e;
  uint8_t instruction [11];
  int16_t immediate_local;
  int32_t offset_local;
  sysbvm_x86_register_t destination_local;
  sysbvm_bytecodeJit_t *jit_local;
  
  instruction._3_2_ = immediate;
  instruction._5_4_ = offset;
  unique0x1000006a = destination;
  local_25[0] = sysbvm_jit_x86_rex(true,false,false,SYSBVM_X86_64_ARG0 < destination);
  local_25[1] = 199;
  local_25[2] = sysbvm_jit_x86_modRM((int8_t)stack0xffffffffffffffec,'\0','\x02');
  local_22 = (uint8_t)instruction._5_4_;
  local_21 = SUB41(instruction._5_4_,1);
  local_20 = SUB41(instruction._5_4_,2);
  local_1f = SUB41(instruction._5_4_,3);
  local_1e = (uint8_t)instruction._3_2_;
  instruction[0] = SUB21(instruction._3_2_,1);
  instruction[1] = (uint8_t)((short)instruction._3_2_ >> 0xf);
  instruction[2] = instruction[1];
  sysbvm_bytecodeJit_addBytes(jit,0xb,local_25);
  return;
}

Assistant:

static void sysbvm_jit_x86_movImmediateI32IntoMemory64WithOffset(sysbvm_bytecodeJit_t *jit, sysbvm_x86_register_t destination, int32_t offset, int16_t immediate)
{
    uint8_t instruction[] = {
        sysbvm_jit_x86_rex(true, false, false, destination > SYSBVM_X86_REG_HALF_MASK),
        0xC7,
        sysbvm_jit_x86_modRM(destination, 0, 2),
        offset & 0xFF, (offset >> 8) & 0xFF, (offset >> 16) & 0xFF, (offset >> 24) & 0xFF,
        immediate & 0xFF, (immediate >> 8) & 0xFF, (immediate >> 16) & 0xFF, (immediate >> 24) & 0xFF,
    };

    sysbvm_bytecodeJit_addBytes(jit, sizeof(instruction), instruction);
}